

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O2

void __thiscall Rml::Element::Release(Element *this)

{
  String local_28;
  
  if (this->instancer != (ElementInstancer *)0x0) {
    (*this->instancer->_vptr_ElementInstancer[3])();
    return;
  }
  GetAddress_abi_cxx11_(&local_28,this,false,true);
  Log::Message(LT_WARNING,
               "Leak detected: element %s not instanced via RmlUi Factory. Unable to release.",
               local_28._M_dataplus._M_p);
  ::std::__cxx11::string::~string((string *)&local_28);
  return;
}

Assistant:

void Element::Release()
{
	if (instancer)
		instancer->ReleaseElement(this);
	else
		Log::Message(Log::LT_WARNING, "Leak detected: element %s not instanced via RmlUi Factory. Unable to release.", GetAddress().c_str());
}